

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_add(run_container_t *run,uint16_t pos)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  uint16_t in_SI;
  int *in_RDI;
  int32_t le;
  int32_t offset;
  int32_t index;
  uint16_t in_stack_ffffffffffffffde;
  uint in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  iVar2 = interleavedBinarySearch(*(rle16_t **)(in_RDI + 2),*in_RDI,in_SI);
  if (-1 < iVar2) {
    return false;
  }
  iVar1 = -iVar2;
  iVar3 = iVar1 + -2;
  if (-1 < iVar3) {
    in_stack_ffffffffffffffe4 =
         (uint)in_SI - (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)iVar3 * 4);
    in_stack_ffffffffffffffe0 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)iVar3 * 4);
    if (in_stack_ffffffffffffffe4 <= (int)in_stack_ffffffffffffffe0) {
      return false;
    }
    if (in_stack_ffffffffffffffe4 == in_stack_ffffffffffffffe0 + 1) {
      if ((iVar1 + -1 < *in_RDI) &&
         ((uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)(iVar1 + -1) * 4) == in_SI + 1)) {
        *(short *)(*(long *)(in_RDI + 2) + 2 + (long)iVar3 * 4) =
             (*(short *)(*(long *)(in_RDI + 2) + (long)(iVar1 + -1) * 4) +
             *(short *)(*(long *)(in_RDI + 2) + 2 + (long)(iVar1 + -1) * 4)) -
             *(short *)(*(long *)(in_RDI + 2) + (long)iVar3 * 4);
        recoverRoomAtIndex((run_container_t *)
                           CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffde);
        return true;
      }
      *(short *)(*(long *)(in_RDI + 2) + 2 + (long)iVar3 * 4) =
           *(short *)(*(long *)(in_RDI + 2) + 2 + (long)iVar3 * 4) + 1;
      return true;
    }
    if ((iVar1 + -1 < *in_RDI) &&
       ((uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)(iVar1 + -1) * 4) == in_SI + 1)) {
      *(uint16_t *)(*(long *)(in_RDI + 2) + (long)(iVar1 + -1) * 4) = in_SI;
      *(short *)(*(long *)(in_RDI + 2) + 2 + (long)(iVar1 + -1) * 4) =
           *(short *)(*(long *)(in_RDI + 2) + 2 + (long)(iVar1 + -1) * 4) + 1;
      return true;
    }
  }
  if (((iVar3 == -1) && (0 < *in_RDI)) && ((uint)**(ushort **)(in_RDI + 2) == in_SI + 1)) {
    *(short *)(*(long *)(in_RDI + 2) + 2) = *(short *)(*(long *)(in_RDI + 2) + 2) + 1;
    **(short **)(in_RDI + 2) = **(short **)(in_RDI + 2) + -1;
  }
  else {
    makeRoomAtIndex((run_container_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                    ,in_stack_ffffffffffffffde);
    *(uint16_t *)(*(long *)(in_RDI + 2) + (long)(iVar1 + -1) * 4) = in_SI;
    *(undefined2 *)(*(long *)(in_RDI + 2) + 2 + (long)(iVar1 + -1) * 4) = 0;
  }
  return true;
}

Assistant:

bool run_container_add(run_container_t *run, uint16_t pos) {
    int32_t index = interleavedBinarySearch(run->runs, run->n_runs, pos);
    if (index >= 0) return false;  // already there
    index = -index - 2;            // points to preceding value, possibly -1
    if (index >= 0) {              // possible match
        int32_t offset = pos - run->runs[index].value;
        int32_t le = run->runs[index].length;
        if (offset <= le) return false;  // already there
        if (offset == le + 1) {
            // we may need to fuse
            if (index + 1 < run->n_runs) {
                if (run->runs[index + 1].value == pos + 1) {
                    // indeed fusion is needed
                    run->runs[index].length = run->runs[index + 1].value +
                                              run->runs[index + 1].length -
                                              run->runs[index].value;
                    recoverRoomAtIndex(run, (uint16_t)(index + 1));
                    return true;
                }
            }
            run->runs[index].length++;
            return true;
        }
        if (index + 1 < run->n_runs) {
            // we may need to fuse
            if (run->runs[index + 1].value == pos + 1) {
                // indeed fusion is needed
                run->runs[index + 1].value = pos;
                run->runs[index + 1].length = run->runs[index + 1].length + 1;
                return true;
            }
        }
    }
    if (index == -1) {
        // we may need to extend the first run
        if (0 < run->n_runs) {
            if (run->runs[0].value == pos + 1) {
                run->runs[0].length++;
                run->runs[0].value--;
                return true;
            }
        }
    }
    makeRoomAtIndex(run, (uint16_t)(index + 1));
    run->runs[index + 1].value = pos;
    run->runs[index + 1].length = 0;
    return true;
}